

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint32_t roaring_bitmap_minimum(roaring_bitmap_t *bm)

{
  undefined2 uVar1;
  uint16_t uVar2;
  int *in_RDI;
  uint32_t lowvalue;
  uint32_t key;
  uint8_t type;
  container_t *c;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint32_t local_4;
  
  if (*in_RDI < 1) {
    local_4 = 0xffffffff;
  }
  else {
    uVar1 = **(undefined2 **)(in_RDI + 4);
    uVar2 = container_minimum((container_t *)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),'\0');
    local_4 = CONCAT22(uVar1,uVar2);
  }
  return local_4;
}

Assistant:

uint32_t roaring_bitmap_minimum(const roaring_bitmap_t *bm) {
    if (bm->high_low_container.size > 0) {
        container_t *c = bm->high_low_container.containers[0];
        uint8_t type = bm->high_low_container.typecodes[0];
        uint32_t key = bm->high_low_container.keys[0];
        uint32_t lowvalue = container_minimum(c, type);
        return lowvalue | (key << 16);
    }
    return UINT32_MAX;
}